

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O3

void stbir__vertical_gather_with_8_coeffs_cont
               (float *outputp,float *vertical_coefficients,float **inputs,float *input0_end)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float *pfVar146;
  float *pfVar147;
  float *pfVar148;
  float *pfVar149;
  float *pfVar150;
  float *pfVar151;
  float *pfVar152;
  float *pfVar153;
  long lVar154;
  long lVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  
  pfVar146 = *inputs;
  pfVar150 = inputs[1];
  fVar156 = (float)*(undefined8 *)vertical_coefficients;
  fVar157 = (float)((ulong)*(undefined8 *)vertical_coefficients >> 0x20);
  fVar158 = (float)*(undefined8 *)(vertical_coefficients + 2);
  fVar159 = (float)((ulong)*(undefined8 *)(vertical_coefficients + 2) >> 0x20);
  fVar160 = (float)*(undefined8 *)(vertical_coefficients + 4);
  fVar161 = (float)((ulong)*(undefined8 *)(vertical_coefficients + 4) >> 0x20);
  fVar162 = (float)*(undefined8 *)(vertical_coefficients + 6);
  fVar163 = (float)((ulong)*(undefined8 *)(vertical_coefficients + 6) >> 0x20);
  pfVar149 = inputs[2];
  pfVar151 = inputs[3];
  pfVar152 = inputs[4];
  pfVar153 = inputs[5];
  pfVar148 = inputs[6];
  pfVar147 = inputs[7];
  lVar154 = (long)input0_end - (long)pfVar146;
  if (0x3f < lVar154) {
    lVar155 = 0;
    do {
      pfVar1 = (float *)((long)outputp + lVar155);
      fVar11 = pfVar1[1];
      fVar12 = pfVar1[2];
      fVar13 = pfVar1[3];
      pfVar2 = (float *)((long)outputp + lVar155 + 0x10);
      fVar14 = *pfVar2;
      fVar15 = pfVar2[1];
      fVar16 = pfVar2[2];
      fVar17 = pfVar2[3];
      pfVar2 = (float *)((long)outputp + lVar155 + 0x20);
      fVar18 = *pfVar2;
      fVar19 = pfVar2[1];
      fVar20 = pfVar2[2];
      fVar21 = pfVar2[3];
      pfVar2 = (float *)((long)outputp + lVar155 + 0x30);
      fVar22 = *pfVar2;
      fVar23 = pfVar2[1];
      fVar24 = pfVar2[2];
      fVar25 = pfVar2[3];
      pfVar2 = (float *)((long)pfVar146 + lVar155);
      fVar26 = pfVar2[1];
      fVar27 = pfVar2[2];
      fVar28 = pfVar2[3];
      pfVar3 = (float *)((long)pfVar146 + lVar155 + 0x10);
      fVar29 = *pfVar3;
      fVar30 = pfVar3[1];
      fVar31 = pfVar3[2];
      fVar32 = pfVar3[3];
      pfVar3 = (float *)((long)pfVar146 + lVar155 + 0x20);
      fVar33 = *pfVar3;
      fVar34 = pfVar3[1];
      fVar35 = pfVar3[2];
      fVar36 = pfVar3[3];
      pfVar3 = (float *)((long)pfVar146 + lVar155 + 0x30);
      fVar37 = *pfVar3;
      fVar38 = pfVar3[1];
      fVar39 = pfVar3[2];
      fVar40 = pfVar3[3];
      pfVar3 = (float *)((long)pfVar150 + lVar155);
      fVar41 = pfVar3[1];
      fVar42 = pfVar3[2];
      fVar43 = pfVar3[3];
      pfVar4 = (float *)((long)pfVar150 + lVar155 + 0x10);
      fVar44 = *pfVar4;
      fVar45 = pfVar4[1];
      fVar46 = pfVar4[2];
      fVar47 = pfVar4[3];
      pfVar4 = (float *)((long)pfVar150 + lVar155 + 0x20);
      fVar48 = *pfVar4;
      fVar49 = pfVar4[1];
      fVar50 = pfVar4[2];
      fVar51 = pfVar4[3];
      pfVar4 = (float *)((long)pfVar150 + lVar155 + 0x30);
      fVar52 = *pfVar4;
      fVar53 = pfVar4[1];
      fVar54 = pfVar4[2];
      fVar55 = pfVar4[3];
      pfVar4 = (float *)((long)pfVar149 + lVar155);
      fVar56 = pfVar4[1];
      fVar57 = pfVar4[2];
      fVar58 = pfVar4[3];
      pfVar5 = (float *)((long)pfVar149 + lVar155 + 0x10);
      fVar59 = *pfVar5;
      fVar60 = pfVar5[1];
      fVar61 = pfVar5[2];
      fVar62 = pfVar5[3];
      pfVar5 = (float *)((long)pfVar149 + lVar155 + 0x20);
      fVar63 = *pfVar5;
      fVar64 = pfVar5[1];
      fVar65 = pfVar5[2];
      fVar66 = pfVar5[3];
      pfVar5 = (float *)((long)pfVar149 + lVar155 + 0x30);
      fVar67 = *pfVar5;
      fVar68 = pfVar5[1];
      fVar69 = pfVar5[2];
      fVar70 = pfVar5[3];
      pfVar5 = (float *)((long)pfVar151 + lVar155);
      fVar71 = pfVar5[1];
      fVar72 = pfVar5[2];
      fVar73 = pfVar5[3];
      pfVar6 = (float *)((long)pfVar151 + lVar155 + 0x10);
      fVar74 = *pfVar6;
      fVar75 = pfVar6[1];
      fVar76 = pfVar6[2];
      fVar77 = pfVar6[3];
      pfVar6 = (float *)((long)pfVar151 + lVar155 + 0x20);
      fVar78 = *pfVar6;
      fVar79 = pfVar6[1];
      fVar80 = pfVar6[2];
      fVar81 = pfVar6[3];
      pfVar6 = (float *)((long)pfVar151 + lVar155 + 0x30);
      fVar82 = *pfVar6;
      fVar83 = pfVar6[1];
      fVar84 = pfVar6[2];
      fVar85 = pfVar6[3];
      pfVar6 = (float *)((long)pfVar152 + lVar155);
      fVar86 = pfVar6[1];
      fVar87 = pfVar6[2];
      fVar88 = pfVar6[3];
      pfVar7 = (float *)((long)pfVar152 + lVar155 + 0x10);
      fVar89 = *pfVar7;
      fVar90 = pfVar7[1];
      fVar91 = pfVar7[2];
      fVar92 = pfVar7[3];
      pfVar7 = (float *)((long)pfVar152 + lVar155 + 0x20);
      fVar93 = *pfVar7;
      fVar94 = pfVar7[1];
      fVar95 = pfVar7[2];
      fVar96 = pfVar7[3];
      pfVar7 = (float *)((long)pfVar152 + lVar155 + 0x30);
      fVar97 = *pfVar7;
      fVar98 = pfVar7[1];
      fVar99 = pfVar7[2];
      fVar100 = pfVar7[3];
      pfVar7 = (float *)((long)pfVar153 + lVar155);
      fVar101 = pfVar7[1];
      fVar102 = pfVar7[2];
      fVar103 = pfVar7[3];
      pfVar8 = (float *)((long)pfVar153 + lVar155 + 0x10);
      fVar104 = *pfVar8;
      fVar105 = pfVar8[1];
      fVar106 = pfVar8[2];
      fVar107 = pfVar8[3];
      pfVar8 = (float *)((long)pfVar153 + lVar155 + 0x20);
      fVar108 = *pfVar8;
      fVar109 = pfVar8[1];
      fVar110 = pfVar8[2];
      fVar111 = pfVar8[3];
      pfVar8 = (float *)((long)pfVar153 + lVar155 + 0x30);
      fVar112 = *pfVar8;
      fVar113 = pfVar8[1];
      fVar114 = pfVar8[2];
      fVar115 = pfVar8[3];
      pfVar8 = (float *)((long)pfVar148 + lVar155);
      fVar116 = pfVar8[1];
      fVar117 = pfVar8[2];
      fVar118 = pfVar8[3];
      pfVar9 = (float *)((long)pfVar148 + lVar155 + 0x10);
      fVar119 = *pfVar9;
      fVar120 = pfVar9[1];
      fVar121 = pfVar9[2];
      fVar122 = pfVar9[3];
      pfVar9 = (float *)((long)pfVar148 + lVar155 + 0x20);
      fVar123 = *pfVar9;
      fVar124 = pfVar9[1];
      fVar125 = pfVar9[2];
      fVar126 = pfVar9[3];
      pfVar9 = (float *)((long)pfVar148 + lVar155 + 0x30);
      fVar127 = *pfVar9;
      fVar128 = pfVar9[1];
      fVar129 = pfVar9[2];
      fVar130 = pfVar9[3];
      pfVar9 = (float *)((long)pfVar147 + lVar155);
      fVar131 = pfVar9[1];
      fVar132 = pfVar9[2];
      fVar133 = pfVar9[3];
      pfVar10 = (float *)((long)pfVar147 + lVar155 + 0x10);
      fVar134 = *pfVar10;
      fVar135 = pfVar10[1];
      fVar136 = pfVar10[2];
      fVar137 = pfVar10[3];
      pfVar10 = (float *)((long)pfVar147 + lVar155 + 0x20);
      fVar138 = *pfVar10;
      fVar139 = pfVar10[1];
      fVar140 = pfVar10[2];
      fVar141 = pfVar10[3];
      pfVar10 = (float *)((long)pfVar147 + lVar155 + 0x30);
      fVar142 = *pfVar10;
      fVar143 = pfVar10[1];
      fVar144 = pfVar10[2];
      fVar145 = pfVar10[3];
      pfVar10 = (float *)((long)outputp + lVar155);
      *pfVar10 = *pfVar9 * fVar163 +
                 *pfVar8 * fVar162 +
                 *pfVar7 * fVar161 +
                 *pfVar6 * fVar160 +
                 *pfVar5 * fVar159 +
                 *pfVar4 * fVar158 + *pfVar3 * fVar157 + *pfVar2 * fVar156 + *pfVar1;
      pfVar10[1] = fVar131 * fVar163 +
                   fVar116 * fVar162 +
                   fVar101 * fVar161 +
                   fVar86 * fVar160 +
                   fVar71 * fVar159 +
                   fVar56 * fVar158 + fVar41 * fVar157 + fVar26 * fVar156 + fVar11;
      pfVar10[2] = fVar132 * fVar163 +
                   fVar117 * fVar162 +
                   fVar102 * fVar161 +
                   fVar87 * fVar160 +
                   fVar72 * fVar159 +
                   fVar57 * fVar158 + fVar42 * fVar157 + fVar27 * fVar156 + fVar12;
      pfVar10[3] = fVar133 * fVar163 +
                   fVar118 * fVar162 +
                   fVar103 * fVar161 +
                   fVar88 * fVar160 +
                   fVar73 * fVar159 +
                   fVar58 * fVar158 + fVar43 * fVar157 + fVar28 * fVar156 + fVar13;
      pfVar1 = (float *)((long)outputp + lVar155 + 0x10);
      *pfVar1 = fVar134 * fVar163 +
                fVar119 * fVar162 +
                fVar104 * fVar161 +
                fVar89 * fVar160 +
                fVar74 * fVar159 + fVar59 * fVar158 + fVar44 * fVar157 + fVar29 * fVar156 + fVar14;
      pfVar1[1] = fVar135 * fVar163 +
                  fVar120 * fVar162 +
                  fVar105 * fVar161 +
                  fVar90 * fVar160 +
                  fVar75 * fVar159 + fVar60 * fVar158 + fVar45 * fVar157 + fVar30 * fVar156 + fVar15
      ;
      pfVar1[2] = fVar136 * fVar163 +
                  fVar121 * fVar162 +
                  fVar106 * fVar161 +
                  fVar91 * fVar160 +
                  fVar76 * fVar159 + fVar61 * fVar158 + fVar46 * fVar157 + fVar31 * fVar156 + fVar16
      ;
      pfVar1[3] = fVar137 * fVar163 +
                  fVar122 * fVar162 +
                  fVar107 * fVar161 +
                  fVar92 * fVar160 +
                  fVar77 * fVar159 + fVar62 * fVar158 + fVar47 * fVar157 + fVar32 * fVar156 + fVar17
      ;
      pfVar1 = (float *)((long)outputp + lVar155 + 0x20);
      *pfVar1 = fVar138 * fVar163 +
                fVar123 * fVar162 +
                fVar108 * fVar161 +
                fVar93 * fVar160 +
                fVar78 * fVar159 + fVar63 * fVar158 + fVar48 * fVar157 + fVar33 * fVar156 + fVar18;
      pfVar1[1] = fVar139 * fVar163 +
                  fVar124 * fVar162 +
                  fVar109 * fVar161 +
                  fVar94 * fVar160 +
                  fVar79 * fVar159 + fVar64 * fVar158 + fVar49 * fVar157 + fVar34 * fVar156 + fVar19
      ;
      pfVar1[2] = fVar140 * fVar163 +
                  fVar125 * fVar162 +
                  fVar110 * fVar161 +
                  fVar95 * fVar160 +
                  fVar80 * fVar159 + fVar65 * fVar158 + fVar50 * fVar157 + fVar35 * fVar156 + fVar20
      ;
      pfVar1[3] = fVar141 * fVar163 +
                  fVar126 * fVar162 +
                  fVar111 * fVar161 +
                  fVar96 * fVar160 +
                  fVar81 * fVar159 + fVar66 * fVar158 + fVar51 * fVar157 + fVar36 * fVar156 + fVar21
      ;
      pfVar1 = (float *)((long)outputp + lVar155 + 0x30);
      *pfVar1 = fVar142 * fVar163 +
                fVar127 * fVar162 +
                fVar112 * fVar161 +
                fVar97 * fVar160 +
                fVar82 * fVar159 + fVar67 * fVar158 + fVar52 * fVar157 + fVar37 * fVar156 + fVar22;
      pfVar1[1] = fVar143 * fVar163 +
                  fVar128 * fVar162 +
                  fVar113 * fVar161 +
                  fVar98 * fVar160 +
                  fVar83 * fVar159 + fVar68 * fVar158 + fVar53 * fVar157 + fVar38 * fVar156 + fVar23
      ;
      pfVar1[2] = fVar144 * fVar163 +
                  fVar129 * fVar162 +
                  fVar114 * fVar161 +
                  fVar99 * fVar160 +
                  fVar84 * fVar159 + fVar69 * fVar158 + fVar54 * fVar157 + fVar39 * fVar156 + fVar24
      ;
      pfVar1[3] = fVar145 * fVar163 +
                  fVar130 * fVar162 +
                  fVar115 * fVar161 +
                  fVar100 * fVar160 +
                  fVar85 * fVar159 + fVar70 * fVar158 + fVar55 * fVar157 + fVar40 * fVar156 + fVar25
      ;
      lVar155 = lVar155 + 0x40;
      lVar154 = lVar154 + -0x40;
    } while (0x3f < lVar154);
    outputp = (float *)((long)outputp + lVar155);
    pfVar146 = (float *)((long)pfVar146 + lVar155);
    pfVar150 = (float *)((long)pfVar150 + lVar155);
    pfVar149 = (float *)((long)pfVar149 + lVar155);
    pfVar151 = (float *)((long)pfVar151 + lVar155);
    pfVar152 = (float *)((long)pfVar152 + lVar155);
    pfVar153 = (float *)((long)pfVar153 + lVar155);
    pfVar148 = (float *)((long)pfVar148 + lVar155);
    pfVar147 = (float *)((long)pfVar147 + lVar155);
  }
  if (0xf < lVar154) {
    lVar155 = (long)input0_end - (long)pfVar146;
    lVar154 = 0;
    do {
      pfVar1 = (float *)((long)outputp + lVar154);
      fVar11 = pfVar1[1];
      fVar12 = pfVar1[2];
      fVar13 = pfVar1[3];
      pfVar2 = (float *)((long)pfVar146 + lVar154);
      fVar14 = pfVar2[1];
      fVar15 = pfVar2[2];
      fVar16 = pfVar2[3];
      pfVar3 = (float *)((long)pfVar150 + lVar154);
      fVar17 = pfVar3[1];
      fVar18 = pfVar3[2];
      fVar19 = pfVar3[3];
      pfVar4 = (float *)((long)pfVar149 + lVar154);
      fVar20 = pfVar4[1];
      fVar21 = pfVar4[2];
      fVar22 = pfVar4[3];
      pfVar5 = (float *)((long)pfVar151 + lVar154);
      fVar23 = pfVar5[1];
      fVar24 = pfVar5[2];
      fVar25 = pfVar5[3];
      pfVar6 = (float *)((long)pfVar152 + lVar154);
      fVar26 = pfVar6[1];
      fVar27 = pfVar6[2];
      fVar28 = pfVar6[3];
      pfVar7 = (float *)((long)pfVar153 + lVar154);
      fVar29 = pfVar7[1];
      fVar30 = pfVar7[2];
      fVar31 = pfVar7[3];
      pfVar8 = (float *)((long)pfVar148 + lVar154);
      fVar32 = pfVar8[1];
      fVar33 = pfVar8[2];
      fVar34 = pfVar8[3];
      pfVar9 = (float *)((long)pfVar147 + lVar154);
      fVar35 = pfVar9[1];
      fVar36 = pfVar9[2];
      fVar37 = pfVar9[3];
      pfVar10 = (float *)((long)outputp + lVar154);
      *pfVar10 = *pfVar9 * fVar163 +
                 *pfVar8 * fVar162 +
                 *pfVar7 * fVar161 +
                 *pfVar6 * fVar160 +
                 *pfVar5 * fVar159 +
                 *pfVar4 * fVar158 + *pfVar3 * fVar157 + *pfVar2 * fVar156 + *pfVar1;
      pfVar10[1] = fVar35 * fVar163 +
                   fVar32 * fVar162 +
                   fVar29 * fVar161 +
                   fVar26 * fVar160 +
                   fVar23 * fVar159 +
                   fVar20 * fVar158 + fVar17 * fVar157 + fVar14 * fVar156 + fVar11;
      pfVar10[2] = fVar36 * fVar163 +
                   fVar33 * fVar162 +
                   fVar30 * fVar161 +
                   fVar27 * fVar160 +
                   fVar24 * fVar159 +
                   fVar21 * fVar158 + fVar18 * fVar157 + fVar15 * fVar156 + fVar12;
      pfVar10[3] = fVar37 * fVar163 +
                   fVar34 * fVar162 +
                   fVar31 * fVar161 +
                   fVar28 * fVar160 +
                   fVar25 * fVar159 +
                   fVar22 * fVar158 + fVar19 * fVar157 + fVar16 * fVar156 + fVar13;
      lVar154 = lVar154 + 0x10;
      lVar155 = lVar155 + -0x10;
    } while (0xf < lVar155);
    outputp = (float *)((long)outputp + lVar154);
    pfVar146 = (float *)((long)pfVar146 + lVar154);
    pfVar150 = (float *)((long)pfVar150 + lVar154);
    pfVar149 = (float *)((long)pfVar149 + lVar154);
    pfVar151 = (float *)((long)pfVar151 + lVar154);
    pfVar152 = (float *)((long)pfVar152 + lVar154);
    pfVar153 = (float *)((long)pfVar153 + lVar154);
    pfVar148 = (float *)((long)pfVar148 + lVar154);
    pfVar147 = (float *)((long)pfVar147 + lVar154);
  }
  if (pfVar146 < input0_end) {
    lVar154 = 0;
    do {
      pfVar1 = (float *)((long)pfVar146 + lVar154);
      *(float *)((long)outputp + lVar154) =
           *(float *)((long)pfVar147 + lVar154) * fVar163 +
           *(float *)((long)pfVar153 + lVar154) * fVar161 +
           *(float *)((long)pfVar151 + lVar154) * fVar159 +
           *(float *)((long)pfVar150 + lVar154) * fVar157 +
           *(float *)((long)outputp + lVar154) + *pfVar1 * fVar156 +
           *(float *)((long)pfVar149 + lVar154) * fVar158 +
           *(float *)((long)pfVar152 + lVar154) * fVar160 +
           *(float *)((long)pfVar148 + lVar154) * fVar162;
      lVar154 = lVar154 + 4;
    } while (pfVar1 + 1 < input0_end);
  }
  return;
}

Assistant:

static void STBIR_chans( stbir__vertical_gather_with_,_coeffs)( float * outputp, float const * vertical_coefficients, float const ** inputs, float const * input0_end )
{
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = outputp;

  stbIF0( float const * input0 = inputs[0]; float c0s = vertical_coefficients[0]; )
  stbIF1( float const * input1 = inputs[1]; float c1s = vertical_coefficients[1]; )
  stbIF2( float const * input2 = inputs[2]; float c2s = vertical_coefficients[2]; )
  stbIF3( float const * input3 = inputs[3]; float c3s = vertical_coefficients[3]; )
  stbIF4( float const * input4 = inputs[4]; float c4s = vertical_coefficients[4]; )
  stbIF5( float const * input5 = inputs[5]; float c5s = vertical_coefficients[5]; )
  stbIF6( float const * input6 = inputs[6]; float c6s = vertical_coefficients[6]; )
  stbIF7( float const * input7 = inputs[7]; float c7s = vertical_coefficients[7]; )

#if ( STBIR__vertical_channels == 1 ) && !defined(STB_IMAGE_RESIZE_VERTICAL_CONTINUE)
  // check single channel one weight
  if ( ( c0s >= (1.0f-0.000001f) ) && ( c0s <= (1.0f+0.000001f) ) )
  {
    STBIR_MEMCPY( output, input0, (char*)input0_end - (char*)input0 );
    return;
  }
#endif

  #ifdef STBIR_SIMD
  {
    stbIF0(stbir__simdfX c0 = stbir__simdf_frepX( c0s ); )
    stbIF1(stbir__simdfX c1 = stbir__simdf_frepX( c1s ); )
    stbIF2(stbir__simdfX c2 = stbir__simdf_frepX( c2s ); )
    stbIF3(stbir__simdfX c3 = stbir__simdf_frepX( c3s ); )
    stbIF4(stbir__simdfX c4 = stbir__simdf_frepX( c4s ); )
    stbIF5(stbir__simdfX c5 = stbir__simdf_frepX( c5s ); )
    stbIF6(stbir__simdfX c6 = stbir__simdf_frepX( c6s ); )
    stbIF7(stbir__simdfX c7 = stbir__simdf_frepX( c7s ); )

    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input0_end - (char*) input0 ) >= (16*stbir__simdfX_float_count) )
    {
      stbir__simdfX o0, o1, o2, o3, r0, r1, r2, r3;
      STBIR_SIMD_NO_UNROLL(output);

      // prefetch four loop iterations ahead (doesn't affect much for small resizes, but helps with big ones)
      stbIF0( stbir__prefetch( input0 + (16*stbir__simdfX_float_count) ); )
      stbIF1( stbir__prefetch( input1 + (16*stbir__simdfX_float_count) ); )
      stbIF2( stbir__prefetch( input2 + (16*stbir__simdfX_float_count) ); )
      stbIF3( stbir__prefetch( input3 + (16*stbir__simdfX_float_count) ); )
      stbIF4( stbir__prefetch( input4 + (16*stbir__simdfX_float_count) ); )
      stbIF5( stbir__prefetch( input5 + (16*stbir__simdfX_float_count) ); )
      stbIF6( stbir__prefetch( input6 + (16*stbir__simdfX_float_count) ); )
      stbIF7( stbir__prefetch( input7 + (16*stbir__simdfX_float_count) ); )

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdfX_load( o0, output );      stbir__simdfX_load( o1, output+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( o3, output+(3*stbir__simdfX_float_count) );
              stbir__simdfX_load( r0, input0 );      stbir__simdfX_load( r1, input0+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input0+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input0+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c0 );  stbir__simdfX_madd( o1, o1, r1, c0 );                         stbir__simdfX_madd( o2, o2, r2, c0 );                             stbir__simdfX_madd( o3, o3, r3, c0 ); )
      #else
      stbIF0( stbir__simdfX_load( r0, input0 );      stbir__simdfX_load( r1, input0+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input0+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input0+(3*stbir__simdfX_float_count) );
              stbir__simdfX_mult( o0, r0, c0 );      stbir__simdfX_mult( o1, r1, c0 );                             stbir__simdfX_mult( o2, r2, c0 );                                 stbir__simdfX_mult( o3, r3, c0 );  )
      #endif

      stbIF1( stbir__simdfX_load( r0, input1 );      stbir__simdfX_load( r1, input1+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input1+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input1+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c1 );  stbir__simdfX_madd( o1, o1, r1, c1 );                         stbir__simdfX_madd( o2, o2, r2, c1 );                             stbir__simdfX_madd( o3, o3, r3, c1 ); )
      stbIF2( stbir__simdfX_load( r0, input2 );      stbir__simdfX_load( r1, input2+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input2+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input2+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c2 );  stbir__simdfX_madd( o1, o1, r1, c2 );                         stbir__simdfX_madd( o2, o2, r2, c2 );                             stbir__simdfX_madd( o3, o3, r3, c2 ); )
      stbIF3( stbir__simdfX_load( r0, input3 );      stbir__simdfX_load( r1, input3+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input3+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input3+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c3 );  stbir__simdfX_madd( o1, o1, r1, c3 );                         stbir__simdfX_madd( o2, o2, r2, c3 );                             stbir__simdfX_madd( o3, o3, r3, c3 ); )
      stbIF4( stbir__simdfX_load( r0, input4 );      stbir__simdfX_load( r1, input4+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input4+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input4+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c4 );  stbir__simdfX_madd( o1, o1, r1, c4 );                         stbir__simdfX_madd( o2, o2, r2, c4 );                             stbir__simdfX_madd( o3, o3, r3, c4 ); )
      stbIF5( stbir__simdfX_load( r0, input5 );      stbir__simdfX_load( r1, input5+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input5+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input5+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c5 );  stbir__simdfX_madd( o1, o1, r1, c5 );                         stbir__simdfX_madd( o2, o2, r2, c5 );                             stbir__simdfX_madd( o3, o3, r3, c5 ); )
      stbIF6( stbir__simdfX_load( r0, input6 );      stbir__simdfX_load( r1, input6+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input6+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input6+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c6 );  stbir__simdfX_madd( o1, o1, r1, c6 );                         stbir__simdfX_madd( o2, o2, r2, c6 );                             stbir__simdfX_madd( o3, o3, r3, c6 ); )
      stbIF7( stbir__simdfX_load( r0, input7 );      stbir__simdfX_load( r1, input7+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input7+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input7+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c7 );  stbir__simdfX_madd( o1, o1, r1, c7 );                         stbir__simdfX_madd( o2, o2, r2, c7 );                             stbir__simdfX_madd( o3, o3, r3, c7 ); )

      stbir__simdfX_store( output, o0 );             stbir__simdfX_store( output+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output+(2*stbir__simdfX_float_count), o2 );  stbir__simdfX_store( output+(3*stbir__simdfX_float_count), o3 );
      output += (4*stbir__simdfX_float_count);
      stbIF0( input0 += (4*stbir__simdfX_float_count); ) stbIF1( input1 += (4*stbir__simdfX_float_count); ) stbIF2( input2 += (4*stbir__simdfX_float_count); ) stbIF3( input3 += (4*stbir__simdfX_float_count); ) stbIF4( input4 += (4*stbir__simdfX_float_count); ) stbIF5( input5 += (4*stbir__simdfX_float_count); ) stbIF6( input6 += (4*stbir__simdfX_float_count); ) stbIF7( input7 += (4*stbir__simdfX_float_count); )
    }

    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input0_end - (char*) input0 ) >= 16 )
    {
      stbir__simdf o0, r0;
      STBIR_SIMD_NO_UNROLL(output);

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdf_load( o0, output );   stbir__simdf_load( r0, input0 ); stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) ); )
      #else
      stbIF0( stbir__simdf_load( r0, input0 );  stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) ); )
      #endif
      stbIF1( stbir__simdf_load( r0, input1 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c1 ) ); )
      stbIF2( stbir__simdf_load( r0, input2 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c2 ) ); )
      stbIF3( stbir__simdf_load( r0, input3 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c3 ) ); )
      stbIF4( stbir__simdf_load( r0, input4 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c4 ) ); )
      stbIF5( stbir__simdf_load( r0, input5 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c5 ) ); )
      stbIF6( stbir__simdf_load( r0, input6 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c6 ) ); )
      stbIF7( stbir__simdf_load( r0, input7 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c7 ) ); )

      stbir__simdf_store( output, o0 );
      output += 4;
      stbIF0( input0 += 4; ) stbIF1( input1 += 4; ) stbIF2( input2 += 4; ) stbIF3( input3 += 4; ) stbIF4( input4 += 4; ) stbIF5( input5 += 4; ) stbIF6( input6 += 4; ) stbIF7( input7 += 4; )
    }
  }
  #else
  STBIR_NO_UNROLL_LOOP_START
  while ( ( (char*)input0_end - (char*) input0 ) >= 16 )
  {
    float o0, o1, o2, o3;
    STBIR_NO_UNROLL(output);
    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( o0 = output[0] + input0[0] * c0s; o1 = output[1] + input0[1] * c0s; o2 = output[2] + input0[2] * c0s; o3 = output[3] + input0[3] * c0s; )
    #else
    stbIF0( o0  = input0[0] * c0s; o1  = input0[1] * c0s; o2  = input0[2] * c0s; o3  = input0[3] * c0s; )
    #endif
    stbIF1( o0 += input1[0] * c1s; o1 += input1[1] * c1s; o2 += input1[2] * c1s; o3 += input1[3] * c1s; )
    stbIF2( o0 += input2[0] * c2s; o1 += input2[1] * c2s; o2 += input2[2] * c2s; o3 += input2[3] * c2s; )
    stbIF3( o0 += input3[0] * c3s; o1 += input3[1] * c3s; o2 += input3[2] * c3s; o3 += input3[3] * c3s; )
    stbIF4( o0 += input4[0] * c4s; o1 += input4[1] * c4s; o2 += input4[2] * c4s; o3 += input4[3] * c4s; )
    stbIF5( o0 += input5[0] * c5s; o1 += input5[1] * c5s; o2 += input5[2] * c5s; o3 += input5[3] * c5s; )
    stbIF6( o0 += input6[0] * c6s; o1 += input6[1] * c6s; o2 += input6[2] * c6s; o3 += input6[3] * c6s; )
    stbIF7( o0 += input7[0] * c7s; o1 += input7[1] * c7s; o2 += input7[2] * c7s; o3 += input7[3] * c7s; )
    output[0] = o0; output[1] = o1; output[2] = o2; output[3] = o3;
    output += 4;
    stbIF0( input0 += 4; ) stbIF1( input1 += 4; ) stbIF2( input2 += 4; ) stbIF3( input3 += 4; ) stbIF4( input4 += 4; ) stbIF5( input5 += 4; ) stbIF6( input6 += 4; ) stbIF7( input7 += 4; )
  }
  #endif
  STBIR_NO_UNROLL_LOOP_START
  while ( input0 < input0_end )
  {
    float o0;
    STBIR_NO_UNROLL(output);
    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( o0 = output[0] + input0[0] * c0s; )
    #else
    stbIF0( o0  = input0[0] * c0s; )
    #endif
    stbIF1( o0 += input1[0] * c1s; )
    stbIF2( o0 += input2[0] * c2s; )
    stbIF3( o0 += input3[0] * c3s; )
    stbIF4( o0 += input4[0] * c4s; )
    stbIF5( o0 += input5[0] * c5s; )
    stbIF6( o0 += input6[0] * c6s; )
    stbIF7( o0 += input7[0] * c7s; )
    output[0] = o0;
    ++output;
    stbIF0( ++input0; ) stbIF1( ++input1; ) stbIF2( ++input2; ) stbIF3( ++input3; ) stbIF4( ++input4; ) stbIF5( ++input5; ) stbIF6( ++input6; ) stbIF7( ++input7; )
  }
}